

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void extract_reference_file(char *name)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  FILE *__stream_00;
  bool local_43c;
  bool local_43b;
  bool local_43a;
  bool local_439;
  uint local_438;
  uint local_434;
  wchar_t n;
  wchar_t bytes;
  char *p;
  FILE *out;
  FILE *in;
  char buff [1024];
  char *name_local;
  
  snprintf((char *)&in,0x400,"%s/%s.uu",refdir,name);
  __stream = fopen((char *)&in,"r");
  failure("Couldn\'t open reference file %s",&in);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ಁ',(uint)(__stream != (FILE *)0x0),"in != NULL",(void *)0x0);
  if (__stream != (FILE *)0x0) {
    do {
      pcVar3 = fgets((char *)&in,0x400,__stream);
      if (pcVar3 == (char *)0x0) {
        return;
      }
      iVar2 = memcmp(&in,"begin ",6);
    } while (iVar2 != 0);
    __stream_00 = fopen(name,"wb");
    while ((pcVar3 = fgets((char *)&in,0x400,__stream), pcVar3 != (char *)0x0 &&
           (iVar2 = memcmp(&in,"end",3), iVar2 != 0))) {
      local_434 = (int)(char)in - 0x20U & 0x3f;
      _n = (char *)((long)&in + 1);
      while (0 < (int)local_434) {
        local_439 = false;
        if ('\x1f' < *_n) {
          local_439 = *_n < 'a';
        }
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                         ,L'ಚ',(uint)local_439,"VALID_UUDECODE(p[0])",(void *)0x0);
        local_43a = false;
        if ('\x1f' < _n[1]) {
          local_43a = _n[1] < 'a';
        }
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                         ,L'ಛ',(uint)local_43a,"VALID_UUDECODE(p[1])",(void *)0x0);
        pcVar3 = _n + 2;
        local_438 = ((int)_n[1] - 0x20U & 0x3f) << 0xc | ((int)*_n - 0x20U & 0x3f) << 0x12;
        fputc((int)local_438 >> 0x10,__stream_00);
        uVar1 = local_434 - 1;
        if (0 < (int)(local_434 - 1)) {
          local_43b = false;
          if ('\x1f' < *pcVar3) {
            local_43b = *pcVar3 < 'a';
          }
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                           ,L'ಡ',(uint)local_43b,"VALID_UUDECODE(p[0])",(void *)0x0);
          local_438 = ((int)*pcVar3 - 0x20U & 0x3f) << 6 | local_438;
          fputc((int)local_438 >> 8 & 0xff,__stream_00);
          uVar1 = local_434 - 2;
          pcVar3 = _n + 3;
        }
        _n = pcVar3;
        local_434 = uVar1;
        if (0 < (int)local_434) {
          local_43c = false;
          if ('\x1f' < *_n) {
            local_43c = *_n < 'a';
          }
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                           ,L'ಧ',(uint)local_43c,"VALID_UUDECODE(p[0])",(void *)0x0);
          fputc((int)*_n - 0x20U & 0x3f | local_438 & 0xff,__stream_00);
          local_434 = local_434 - 1;
          _n = _n + 1;
        }
      }
    }
    fclose(__stream_00);
    fclose(__stream);
  }
  return;
}

Assistant:

void
extract_reference_file(const char *name)
{
	char buff[1024];
	FILE *in, *out;

	snprintf(buff, sizeof(buff), "%s/%s.uu", refdir, name);
	in = fopen(buff, "r");
	failure("Couldn't open reference file %s", buff);
	assert(in != NULL);
	if (in == NULL)
		return;
	/* Read up to and including the 'begin' line. */
	for (;;) {
		if (fgets(buff, sizeof(buff), in) == NULL) {
			/* TODO: This is a failure. */
			return;
		}
		if (memcmp(buff, "begin ", 6) == 0)
			break;
	}
	/* Now, decode the rest and write it. */
	out = fopen(name, "wb");
	while (fgets(buff, sizeof(buff), in) != NULL) {
		char *p = buff;
		int bytes;

		if (memcmp(buff, "end", 3) == 0)
			break;

		bytes = UUDECODE(*p++);
		while (bytes > 0) {
			int n = 0;
			/* Write out 1-3 bytes from that. */
			assert(VALID_UUDECODE(p[0]));
			assert(VALID_UUDECODE(p[1]));
			n = UUDECODE(*p++) << 18;
			n |= UUDECODE(*p++) << 12;
			fputc(n >> 16, out);
			--bytes;
			if (bytes > 0) {
				assert(VALID_UUDECODE(p[0]));
				n |= UUDECODE(*p++) << 6;
				fputc((n >> 8) & 0xFF, out);
				--bytes;
			}
			if (bytes > 0) {
				assert(VALID_UUDECODE(p[0]));
				n |= UUDECODE(*p++);
				fputc(n & 0xFF, out);
				--bytes;
			}
		}
	}
	fclose(out);
	fclose(in);
}